

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

xmlSchemaTypePtr xmlSchemaGetBuiltInType(xmlSchemaValType type)

{
  int iVar1;
  xmlSchemaTypePtr pxStack_10;
  xmlSchemaValType type_local;
  
  if ((xmlSchemaTypesInitialized == 0) && (iVar1 = xmlSchemaInitTypes(), iVar1 < 0)) {
    pxStack_10 = (xmlSchemaTypePtr)0x0;
  }
  else {
    switch(type) {
    case XML_SCHEMAS_STRING:
      pxStack_10 = xmlSchemaTypeStringDef;
      break;
    case XML_SCHEMAS_NORMSTRING:
      pxStack_10 = xmlSchemaTypeNormStringDef;
      break;
    case XML_SCHEMAS_DECIMAL:
      pxStack_10 = xmlSchemaTypeDecimalDef;
      break;
    case XML_SCHEMAS_TIME:
      pxStack_10 = xmlSchemaTypeTimeDef;
      break;
    case XML_SCHEMAS_GDAY:
      pxStack_10 = xmlSchemaTypeGDayDef;
      break;
    case XML_SCHEMAS_GMONTH:
      pxStack_10 = xmlSchemaTypeGMonthDef;
      break;
    case XML_SCHEMAS_GMONTHDAY:
      pxStack_10 = xmlSchemaTypeGMonthDayDef;
      break;
    case XML_SCHEMAS_GYEAR:
      pxStack_10 = xmlSchemaTypeGYearDef;
      break;
    case XML_SCHEMAS_GYEARMONTH:
      pxStack_10 = xmlSchemaTypeGYearMonthDef;
      break;
    case XML_SCHEMAS_DATE:
      pxStack_10 = xmlSchemaTypeDateDef;
      break;
    case XML_SCHEMAS_DATETIME:
      pxStack_10 = xmlSchemaTypeDatetimeDef;
      break;
    case XML_SCHEMAS_DURATION:
      pxStack_10 = xmlSchemaTypeDurationDef;
      break;
    case XML_SCHEMAS_FLOAT:
      pxStack_10 = xmlSchemaTypeFloatDef;
      break;
    case XML_SCHEMAS_DOUBLE:
      pxStack_10 = xmlSchemaTypeDoubleDef;
      break;
    case XML_SCHEMAS_BOOLEAN:
      pxStack_10 = xmlSchemaTypeBooleanDef;
      break;
    case XML_SCHEMAS_TOKEN:
      pxStack_10 = xmlSchemaTypeTokenDef;
      break;
    case XML_SCHEMAS_LANGUAGE:
      pxStack_10 = xmlSchemaTypeLanguageDef;
      break;
    case XML_SCHEMAS_NMTOKEN:
      pxStack_10 = xmlSchemaTypeNmtokenDef;
      break;
    case XML_SCHEMAS_NMTOKENS:
      pxStack_10 = xmlSchemaTypeNmtokensDef;
      break;
    case XML_SCHEMAS_NAME:
      pxStack_10 = xmlSchemaTypeNameDef;
      break;
    case XML_SCHEMAS_QNAME:
      pxStack_10 = xmlSchemaTypeQNameDef;
      break;
    case XML_SCHEMAS_NCNAME:
      pxStack_10 = xmlSchemaTypeNCNameDef;
      break;
    case XML_SCHEMAS_ID:
      pxStack_10 = xmlSchemaTypeIdDef;
      break;
    case XML_SCHEMAS_IDREF:
      pxStack_10 = xmlSchemaTypeIdrefDef;
      break;
    case XML_SCHEMAS_IDREFS:
      pxStack_10 = xmlSchemaTypeIdrefsDef;
      break;
    case XML_SCHEMAS_ENTITY:
      pxStack_10 = xmlSchemaTypeEntityDef;
      break;
    case XML_SCHEMAS_ENTITIES:
      pxStack_10 = xmlSchemaTypeEntitiesDef;
      break;
    case XML_SCHEMAS_NOTATION:
      pxStack_10 = xmlSchemaTypeNotationDef;
      break;
    case XML_SCHEMAS_ANYURI:
      pxStack_10 = xmlSchemaTypeAnyURIDef;
      break;
    case XML_SCHEMAS_INTEGER:
      pxStack_10 = xmlSchemaTypeIntegerDef;
      break;
    case XML_SCHEMAS_NPINTEGER:
      pxStack_10 = xmlSchemaTypeNonPositiveIntegerDef;
      break;
    case XML_SCHEMAS_NINTEGER:
      pxStack_10 = xmlSchemaTypeNegativeIntegerDef;
      break;
    case XML_SCHEMAS_NNINTEGER:
      pxStack_10 = xmlSchemaTypeNonNegativeIntegerDef;
      break;
    case XML_SCHEMAS_PINTEGER:
      pxStack_10 = xmlSchemaTypePositiveIntegerDef;
      break;
    case XML_SCHEMAS_INT:
      pxStack_10 = xmlSchemaTypeIntDef;
      break;
    case XML_SCHEMAS_UINT:
      pxStack_10 = xmlSchemaTypeUnsignedIntDef;
      break;
    case XML_SCHEMAS_LONG:
      pxStack_10 = xmlSchemaTypeLongDef;
      break;
    case XML_SCHEMAS_ULONG:
      pxStack_10 = xmlSchemaTypeUnsignedLongDef;
      break;
    case XML_SCHEMAS_SHORT:
      pxStack_10 = xmlSchemaTypeShortDef;
      break;
    case XML_SCHEMAS_USHORT:
      pxStack_10 = xmlSchemaTypeUnsignedShortDef;
      break;
    case XML_SCHEMAS_BYTE:
      pxStack_10 = xmlSchemaTypeByteDef;
      break;
    case XML_SCHEMAS_UBYTE:
      pxStack_10 = xmlSchemaTypeUnsignedByteDef;
      break;
    case XML_SCHEMAS_HEXBINARY:
      pxStack_10 = xmlSchemaTypeHexBinaryDef;
      break;
    case XML_SCHEMAS_BASE64BINARY:
      pxStack_10 = xmlSchemaTypeBase64BinaryDef;
      break;
    case XML_SCHEMAS_ANYTYPE:
      pxStack_10 = xmlSchemaTypeAnyTypeDef;
      break;
    case XML_SCHEMAS_ANYSIMPLETYPE:
      pxStack_10 = xmlSchemaTypeAnySimpleTypeDef;
      break;
    default:
      pxStack_10 = (xmlSchemaTypePtr)0x0;
    }
  }
  return pxStack_10;
}

Assistant:

xmlSchemaTypePtr
xmlSchemaGetBuiltInType(xmlSchemaValType type)
{
    if ((xmlSchemaTypesInitialized == 0) &&
	(xmlSchemaInitTypes() < 0))
        return (NULL);
    switch (type) {

	case XML_SCHEMAS_ANYSIMPLETYPE:
	    return (xmlSchemaTypeAnySimpleTypeDef);
	case XML_SCHEMAS_STRING:
	    return (xmlSchemaTypeStringDef);
	case XML_SCHEMAS_NORMSTRING:
	    return (xmlSchemaTypeNormStringDef);
	case XML_SCHEMAS_DECIMAL:
	    return (xmlSchemaTypeDecimalDef);
	case XML_SCHEMAS_TIME:
	    return (xmlSchemaTypeTimeDef);
	case XML_SCHEMAS_GDAY:
	    return (xmlSchemaTypeGDayDef);
	case XML_SCHEMAS_GMONTH:
	    return (xmlSchemaTypeGMonthDef);
	case XML_SCHEMAS_GMONTHDAY:
	    return (xmlSchemaTypeGMonthDayDef);
	case XML_SCHEMAS_GYEAR:
	    return (xmlSchemaTypeGYearDef);
	case XML_SCHEMAS_GYEARMONTH:
	    return (xmlSchemaTypeGYearMonthDef);
	case XML_SCHEMAS_DATE:
	    return (xmlSchemaTypeDateDef);
	case XML_SCHEMAS_DATETIME:
	    return (xmlSchemaTypeDatetimeDef);
	case XML_SCHEMAS_DURATION:
	    return (xmlSchemaTypeDurationDef);
	case XML_SCHEMAS_FLOAT:
	    return (xmlSchemaTypeFloatDef);
	case XML_SCHEMAS_DOUBLE:
	    return (xmlSchemaTypeDoubleDef);
	case XML_SCHEMAS_BOOLEAN:
	    return (xmlSchemaTypeBooleanDef);
	case XML_SCHEMAS_TOKEN:
	    return (xmlSchemaTypeTokenDef);
	case XML_SCHEMAS_LANGUAGE:
	    return (xmlSchemaTypeLanguageDef);
	case XML_SCHEMAS_NMTOKEN:
	    return (xmlSchemaTypeNmtokenDef);
	case XML_SCHEMAS_NMTOKENS:
	    return (xmlSchemaTypeNmtokensDef);
	case XML_SCHEMAS_NAME:
	    return (xmlSchemaTypeNameDef);
	case XML_SCHEMAS_QNAME:
	    return (xmlSchemaTypeQNameDef);
	case XML_SCHEMAS_NCNAME:
	    return (xmlSchemaTypeNCNameDef);
	case XML_SCHEMAS_ID:
	    return (xmlSchemaTypeIdDef);
	case XML_SCHEMAS_IDREF:
	    return (xmlSchemaTypeIdrefDef);
	case XML_SCHEMAS_IDREFS:
	    return (xmlSchemaTypeIdrefsDef);
	case XML_SCHEMAS_ENTITY:
	    return (xmlSchemaTypeEntityDef);
	case XML_SCHEMAS_ENTITIES:
	    return (xmlSchemaTypeEntitiesDef);
	case XML_SCHEMAS_NOTATION:
	    return (xmlSchemaTypeNotationDef);
	case XML_SCHEMAS_ANYURI:
	    return (xmlSchemaTypeAnyURIDef);
	case XML_SCHEMAS_INTEGER:
	    return (xmlSchemaTypeIntegerDef);
	case XML_SCHEMAS_NPINTEGER:
	    return (xmlSchemaTypeNonPositiveIntegerDef);
	case XML_SCHEMAS_NINTEGER:
	    return (xmlSchemaTypeNegativeIntegerDef);
	case XML_SCHEMAS_NNINTEGER:
	    return (xmlSchemaTypeNonNegativeIntegerDef);
	case XML_SCHEMAS_PINTEGER:
	    return (xmlSchemaTypePositiveIntegerDef);
	case XML_SCHEMAS_INT:
	    return (xmlSchemaTypeIntDef);
	case XML_SCHEMAS_UINT:
	    return (xmlSchemaTypeUnsignedIntDef);
	case XML_SCHEMAS_LONG:
	    return (xmlSchemaTypeLongDef);
	case XML_SCHEMAS_ULONG:
	    return (xmlSchemaTypeUnsignedLongDef);
	case XML_SCHEMAS_SHORT:
	    return (xmlSchemaTypeShortDef);
	case XML_SCHEMAS_USHORT:
	    return (xmlSchemaTypeUnsignedShortDef);
	case XML_SCHEMAS_BYTE:
	    return (xmlSchemaTypeByteDef);
	case XML_SCHEMAS_UBYTE:
	    return (xmlSchemaTypeUnsignedByteDef);
	case XML_SCHEMAS_HEXBINARY:
	    return (xmlSchemaTypeHexBinaryDef);
	case XML_SCHEMAS_BASE64BINARY:
	    return (xmlSchemaTypeBase64BinaryDef);
	case XML_SCHEMAS_ANYTYPE:
	    return (xmlSchemaTypeAnyTypeDef);
	default:
	    return (NULL);
    }
}